

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

int canwearobj(obj *otmp,long *mask,boolean noisy)

{
  char cVar1;
  short sVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  char *line;
  char *pcVar6;
  
  if (otmp->oclass == '\x03') {
    cVar1 = objects[otmp->otyp].oc_subtyp;
    if (cVar1 == '\x05') {
      pcVar6 = "cloak";
    }
    else if (cVar1 == '\x06') {
      pcVar6 = "shirt";
    }
    else {
      if (cVar1 != '\0') goto LAB_001836de;
      pcVar6 = "suit";
    }
    bVar3 = breakarm(youmonst.data);
    if ((((bVar3 != '\0') || (bVar3 = sliparm(youmonst.data), bVar3 != '\0')) &&
        ((cVar1 != '\x05' || ((youmonst.data)->msize != '\x01')))) &&
       (iVar4 = racial_exception(&youmonst,otmp), iVar4 < 1)) {
      if (noisy == '\0') {
        return 0;
      }
      pcVar5 = "The %s will not fit on your body.";
      goto LAB_00183820;
    }
  }
LAB_001836de:
  if ((otmp->owornmask & 0x7f) != 0) {
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = "that";
    goto LAB_001836f6;
  }
  iVar4 = welded(uwep);
  if (((iVar4 != 0) && ((byte)(uwep->oclass | 4U) == 6)) &&
     ((objects[uwep->otyp].field_0x11 & 1) != 0)) {
    if (otmp->oclass != '\x03') goto switchD_00183780_default;
    if ((objects[otmp->otyp].oc_subtyp == '\x06') || (objects[otmp->otyp].oc_subtyp == '\0')) {
      if (noisy == '\0') {
        return 0;
      }
      pcVar6 = "weapon";
      if (((uwep->oclass == 2) && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
         (pcVar6 = "weapon", (byte)objects[uwep->otyp].oc_subtyp < 0xb)) {
        pcVar6 = "sword";
      }
      pcVar5 = "You cannot do that while holding your %s.";
      goto LAB_00183820;
    }
  }
  if (otmp->oclass != '\x03') {
switchD_00183780_default:
    if (noisy != '\0') {
      silly_thing("wear",otmp);
      return 0;
    }
    return 0;
  }
  switch(objects[otmp->otyp].oc_subtyp) {
  case '\0':
    if (uarmc != (obj *)0x0) {
      if (noisy == '\0') {
        return 0;
      }
      pcVar6 = cloak_simple_name(uarmc);
      pcVar5 = "You cannot wear armor over a %s.";
LAB_00183820:
      pline(pcVar5,pcVar6);
      return 0;
    }
    if (uarm == (obj *)0x0) {
      *mask = 1;
      return 1;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = "some armor";
    goto LAB_001836f6;
  case '\x01':
    if (uarms == (obj *)0x0) {
      if ((uwep != (obj *)0x0) && ((byte)(uwep->oclass | 4U) == 6)) {
        sVar2 = uwep->otyp;
        if ((objects[sVar2].field_0x11 & 1) != 0) {
          if (noisy == '\0') {
            return 0;
          }
          if ((uwep->oclass == 2) && ((byte)(objects[sVar2].oc_subtyp - 5U) < 6)) {
            pcVar6 = "sword";
          }
          else {
            pcVar6 = "weapon";
            if (sVar2 == 0x1c) {
              pcVar6 = "axe";
            }
          }
          pcVar5 = "You cannot wear a shield while wielding a two-handed %s.";
          goto LAB_00183820;
        }
      }
      if (u.twoweap == '\0') {
        *mask = 8;
        return 1;
      }
      if (noisy == '\0') {
        return 0;
      }
      pcVar6 = "You cannot wear a shield while wielding two weapons.";
LAB_00183bd3:
      pline(pcVar6);
      return 0;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = "shield";
    break;
  case '\x02':
    if (uarmh == (obj *)0x0) {
      if (((u.umonnum == u.umonster) || (iVar4 = num_horns(youmonst.data), iVar4 < 1)) ||
         (((long)otmp->otyp == 0x3d || ((*(ushort *)&objects[otmp->otyp].field_0x11 & 0x180) == 0)))
         ) {
        *mask = 4;
        return 1;
      }
      if (noisy == '\0') {
        return 0;
      }
      iVar4 = num_horns(youmonst.data);
      pcVar5 = "s";
      if (iVar4 == 1) {
        pcVar5 = "";
      }
      line = "The %s won\'t fit over your horn%s.";
      pcVar6 = "helmet";
LAB_00183c43:
      pline(line,pcVar6,pcVar5);
      return 0;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = "helmet";
    break;
  case '\x03':
    if (uarmg == (obj *)0x0) {
      iVar4 = welded(uwep);
      if (iVar4 == 0) {
        *mask = 0x10;
        return 1;
      }
      if (noisy == '\0') {
        return 0;
      }
      pcVar6 = "weapon";
      if (((uwep->oclass == '\x02') && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
         (pcVar6 = "weapon", (byte)objects[uwep->otyp].oc_subtyp < 0xb)) {
        pcVar6 = "sword";
      }
      pcVar5 = "You cannot wear gloves over your %s.";
      goto LAB_00183820;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = "gloves";
    goto LAB_001836f6;
  case '\x04':
    if (uarmf == (obj *)0x0) {
      if (u.umonnum != u.umonster) {
        if (((youmonst.data)->mflags1 & 0x80000) != 0) {
          if (noisy == '\0') {
            return 0;
          }
          pcVar6 = "You have no feet...";
          goto LAB_00183bd3;
        }
        if ((youmonst.data)->mlet == '\x1d') {
          if (noisy == '\0') {
            return 0;
          }
          pcVar5 = "You have too many hooves to wear %s.";
          pcVar6 = "boots";
          goto LAB_00183820;
        }
      }
      if (u.utrap != 0) {
        if (u.utraptype == 4) {
          if (noisy == '\0') {
            return 0;
          }
          pcVar6 = body_part(5);
          pcVar6 = makeplural(pcVar6);
          pcVar5 = surface((int)u.ux,(int)u.uy);
          line = "Your %s are stuck in the %s!";
          goto LAB_00183c43;
        }
        if (u.utraptype == 0) {
          if (noisy == '\0') {
            return 0;
          }
          pcVar6 = body_part(5);
          pcVar5 = "Your %s is trapped!";
          goto LAB_00183820;
        }
      }
      *mask = 0x20;
      return 1;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = "boots";
    goto LAB_001836f6;
  case '\x05':
    if (uarmc == (obj *)0x0) {
      *mask = 2;
      return 1;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = cloak_simple_name(uarmc);
    break;
  case '\x06':
    if ((uarm == (obj *)0x0 && uarmc == (obj *)0x0) && uarmu == (obj *)0x0) {
      *mask = 0x40;
      return 1;
    }
    if (uarmu == (obj *)0x0) {
      if (noisy == '\0') {
        return 0;
      }
      if (uarm == (obj *)0x0 || uarmc != (obj *)0x0) {
        pcVar6 = cloak_simple_name(uarmc);
      }
      else {
        pcVar6 = "armor";
      }
      pcVar5 = "You can\'t wear that over your %s.";
      goto LAB_00183820;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar6 = "shirt";
    break;
  default:
    goto switchD_00183780_default;
  }
  pcVar6 = an(pcVar6);
LAB_001836f6:
  already_wearing(pcVar6);
  return 0;
}

Assistant:

int canwearobj(struct obj *otmp, long *mask, boolean noisy)
{
    int err = 0;
    const char *which;

    which = is_cloak(otmp) ? c_cloak :
	    is_shirt(otmp) ? c_shirt :
	    is_suit(otmp) ? c_suit : 0;
    if (which && cantweararm(youmonst.data) &&
	    /* same exception for cloaks as used in m_dowear() */
	    (which != c_cloak || youmonst.data->msize != MZ_SMALL) &&
	    (racial_exception(&youmonst, otmp) < 1)) {
	if (noisy) pline("The %s will not fit on your body.", which);
	return 0;
    } else if (otmp->owornmask & W_ARMOR) {
	if (noisy) already_wearing(c_that_);
	return 0;
    }

    if (welded(uwep) && bimanual(uwep) && (is_suit(otmp) || is_shirt(otmp))) {
	if (noisy)
	    pline("You cannot do that while holding your %s.",
		is_sword(uwep) ? c_sword : c_weapon);
	return 0;
    }

    if (is_helmet(otmp)) {
	if (uarmh) {
	    if (noisy) already_wearing(an(c_helmet));
	    err++;
	} else if (Upolyd && has_horns(youmonst.data) && !is_flimsy(otmp)) {
	    /* (flimsy exception matches polyself handling) */
	    if (noisy)
		pline("The %s won't fit over your horn%s.",
			  c_helmet, plur(num_horns(youmonst.data)));
	    err++;
	} else
	    *mask = W_ARMH;
    } else if (is_shield(otmp)) {
	if (uarms) {
	    if (noisy) already_wearing(an(c_shield));
	    err++;
	} else if (uwep && bimanual(uwep)) {
	    if (noisy) 
		pline("You cannot wear a shield while wielding a two-handed %s.",
		    is_sword(uwep) ? c_sword :
		    (uwep->otyp == BATTLE_AXE) ? c_axe : c_weapon);
	    err++;
	} else if (u.twoweap) {
	    if (noisy)
		pline("You cannot wear a shield while wielding two weapons.");
	    err++;
	} else
	    *mask = W_ARMS;
    } else if (is_boots(otmp)) {
	if (uarmf) {
	    if (noisy) already_wearing(c_boots);
	    err++;
	} else if (Upolyd && slithy(youmonst.data)) {
	    if (noisy) pline("You have no feet...");	/* not body_part(FOOT) */
	    err++;
	} else if (Upolyd && youmonst.data->mlet == S_CENTAUR) {
	    /* break_armor() pushes boots off for centaurs,
	       so don't let dowear() put them back on... */
	    if (noisy) pline("You have too many hooves to wear %s.",
			     c_boots);	/* makeplural(body_part(FOOT)) yields
					   "rear hooves" which sounds odd */
	    err++;
	} else if (u.utrap && (u.utraptype == TT_BEARTRAP ||
				u.utraptype == TT_INFLOOR)) {
	    if (u.utraptype == TT_BEARTRAP) {
		if (noisy) pline("Your %s is trapped!", body_part(FOOT));
	    } else {
		if (noisy) pline("Your %s are stuck in the %s!",
				makeplural(body_part(FOOT)),
				surface(u.ux, u.uy));
	    }
	    err++;
	} else
	    *mask = W_ARMF;
    } else if (is_gloves(otmp)) {
	if (uarmg) {
	    if (noisy) already_wearing(c_gloves);
	    err++;
	} else if (welded(uwep)) {
	    if (noisy) pline("You cannot wear gloves over your %s.",
			   is_sword(uwep) ? c_sword : c_weapon);
	    err++;
	} else
	    *mask = W_ARMG;
    } else if (is_shirt(otmp)) {
	if (uarm || uarmc || uarmu) {
	    if (uarmu) {
		if (noisy) already_wearing(an(c_shirt));
	    } else {
		if (noisy) pline("You can't wear that over your %s.",
			           (uarm && !uarmc) ? c_armor : cloak_simple_name(uarmc));
	    }
	    err++;
	} else
	    *mask = W_ARMU;
    } else if (is_cloak(otmp)) {
	if (uarmc) {
	    if (noisy) already_wearing(an(cloak_simple_name(uarmc)));
	    err++;
	} else
	    *mask = W_ARMC;
    } else if (is_suit(otmp)) {
	if (uarmc) {
	    if (noisy) pline("You cannot wear armor over a %s.", cloak_simple_name(uarmc));
	    err++;
	} else if (uarm) {
	    if (noisy) already_wearing("some armor");
	    err++;
	} else
	    *mask = W_ARM;
    } else {
	/* getobj can't do this after setting its allow_all flag; that
	   happens if you have armor for slots that are covered up or
	   extra armor for slots that are filled */
	if (noisy) silly_thing("wear", otmp);
	err++;
    }
    return !err;
}